

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_6::GetGPrimPropertyNamesImpl
               (GPrim *gprim,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *prop_names,bool attr_prop,bool rel_prop)

{
  size_type *psVar1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pXVar5;
  long lVar6;
  GPrim *pGVar7;
  undefined4 uVar8;
  _Base_ptr p_Var9;
  long *plVar10;
  long *plVar11;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  OpType *op;
  OpType *extraout_RDX;
  OpType *extraout_RDX_00;
  OpType *extraout_RDX_01;
  OpType *extraout_RDX_02;
  OpType *extraout_RDX_03;
  OpType *extraout_RDX_04;
  OpType *extraout_RDX_05;
  OpType *extraout_RDX_06;
  OpType *extraout_RDX_07;
  OpType *extraout_RDX_08;
  OpType *extraout_RDX_09;
  OpType *extraout_RDX_10;
  XformOp *xop;
  pointer this;
  long lVar12;
  ulong uVar13;
  string varname;
  vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *__range3;
  string rel_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  GPrim *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined4 local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  op = (OpType *)CONCAT71(in_register_00000011,attr_prop);
  if (gprim != (GPrim *)0x0) {
    local_c4 = SUB84(op,0);
    local_f0 = gprim;
    if (attr_prop) {
      if (((((gprim->doubleSided)._empty != false) ||
           ((gprim->doubleSided)._attrib.has_value_ != false)) ||
          ((gprim->doubleSided)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (gprim->doubleSided)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start)) || ((gprim->doubleSided)._blocked == true)) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"doubleSided","",CONCAT71(in_register_00000009,rel_prop));
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_110);
        op = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                   local_110.field_2._M_local_buf[0]) + 1);
          op = extraout_RDX_00;
        }
      }
      if ((((gprim->orientation)._empty != false) ||
          ((gprim->orientation)._attrib.has_value_ != false)) ||
         (((gprim->orientation)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (gprim->orientation)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start || ((gprim->orientation)._blocked == true)))) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"orientation","");
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_110);
        op = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                   local_110.field_2._M_local_buf[0]) + 1);
          op = extraout_RDX_02;
        }
      }
      if ((((gprim->purpose)._empty != false) || ((gprim->purpose)._attrib.has_value_ != false)) ||
         (((gprim->purpose)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (gprim->purpose)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start || ((gprim->purpose)._blocked == true)))) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"purpose","");
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_110);
        op = extraout_RDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                   local_110.field_2._M_local_buf[0]) + 1);
          op = extraout_RDX_04;
        }
      }
      if (((((gprim->extent)._attrib.has_value_ != false) ||
           ((gprim->extent)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (gprim->extent)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start)) || ((gprim->extent)._value_empty != false)) ||
         ((gprim->extent)._blocked == true)) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"extent","");
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_110);
        op = extraout_RDX_05;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                   local_110.field_2._M_local_buf[0]) + 1);
          op = extraout_RDX_06;
        }
      }
      if ((((gprim->visibility)._empty != false) ||
          ((gprim->visibility)._attrib.has_value_ != false)) ||
         (((gprim->visibility)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (gprim->visibility)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start || ((gprim->visibility)._blocked == true)))) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"visibility","");
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_110);
        op = extraout_RDX_07;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                   local_110.field_2._M_local_buf[0]) + 1);
          op = extraout_RDX_08;
        }
      }
      this = (gprim->super_Xformable).xformOps.
             super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
             super__Vector_impl_data._M_start;
      pXVar5 = (gprim->super_Xformable).xformOps.
               super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (this != pXVar5) {
        do {
          if (this->op_type != ResetXformStack) {
            tinyusdz::to_string_abi_cxx11_(&local_110,(tinyusdz *)this,op);
            if ((this->suffix)._M_string_length != 0) {
              ::std::operator+(&local_e8,":",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &this->suffix);
              ::std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_e8._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,
                                CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                         local_e8.field_2._M_local_buf[0]) + 1);
              }
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(prop_names,&local_110);
            op = extraout_RDX_09;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,
                              CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                       local_110.field_2._M_local_buf[0]) + 1);
              op = extraout_RDX_10;
            }
          }
          this = this + 1;
        } while (this != pXVar5);
      }
    }
    pGVar7 = local_f0;
    paVar3 = &local_110.field_2;
    if ((local_f0->super_MaterialBinding).materialBinding.has_value_ == true) {
      local_110._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"material:binding","");
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                 &local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar3) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((pGVar7->super_MaterialBinding).materialBindingPreview.has_value_ == true) {
      local_110._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"material:binding:preview","");
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                 &local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar3) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((pGVar7->super_MaterialBinding).materialBindingFull.has_value_ == true) {
      local_110._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"material:binding:full","");
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                 &local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar3) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
    }
    p_Var9 = (pGVar7->super_MaterialBinding)._materialBindingMap._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    p_Var2 = &(pGVar7->super_MaterialBinding)._materialBindingMap._M_t._M_impl.super__Rb_tree_header
    ;
    if ((_Rb_tree_header *)p_Var9 != p_Var2) {
      do {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_110,"material:binding:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var9 + 1));
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar3) {
          operator_delete(local_110._M_dataplus._M_p,
                          CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                   local_110.field_2._M_local_buf[0]) + 1);
        }
        p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var2);
    }
    p_Var9 = (local_f0->super_MaterialBinding)._materialBindingCollectionMap._M_t._M_impl.
             super__Rb_tree_header._M_header._M_left;
    local_80 = &(local_f0->super_MaterialBinding)._materialBindingCollectionMap._M_t._M_impl.
                super__Rb_tree_header._M_header;
    if (p_Var9 != local_80) {
      paVar4 = &local_c0.field_2;
      do {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        local_110._M_string_length = 0;
        local_110.field_2._M_local_buf[0] = '\0';
        if (p_Var9[1]._M_parent != (_Base_ptr)0x0) {
          ::std::operator+(&local_e8,":",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var9 + 1));
          ::std::__cxx11::string::operator=((string *)&local_110,(string *)&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,
                            CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                     local_e8.field_2._M_local_buf[0]) + 1);
          }
        }
        if (*(long *)(p_Var9 + 4) != 0) {
          lVar12 = 8;
          uVar13 = 0;
          local_78 = p_Var9;
          do {
            lVar6 = *(long *)(p_Var9 + 2);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            local_e8._M_string_length = 0;
            local_e8.field_2._M_local_buf[0] = '\0';
            if (p_Var9[1]._M_parent == (_Base_ptr)0x0) {
              ::std::operator+(&local_c0,"material:binding:collection",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_110);
              ::std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != paVar4) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              local_50[0] = local_40;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,":","");
              plVar10 = (long *)::std::__cxx11::string::replace
                                          ((ulong)local_50,0,(char *)0x0,0x40c28d);
              local_a0 = &local_90;
              plVar11 = plVar10 + 2;
              if ((long *)*plVar10 == plVar11) {
                local_90 = *plVar11;
                lStack_88 = plVar10[3];
              }
              else {
                local_90 = *plVar11;
                local_a0 = (long *)*plVar10;
              }
              local_98 = plVar10[1];
              *plVar10 = (long)plVar11;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_a0,*(ulong *)(lVar6 + -8 + lVar12));
              p_Var9 = local_78;
              plVar11 = plVar10 + 2;
              if ((long *)*plVar10 == plVar11) {
                local_60 = *plVar11;
                lStack_58 = plVar10[3];
                local_70 = &local_60;
              }
              else {
                local_60 = *plVar11;
                local_70 = (long *)*plVar10;
              }
              local_68 = plVar10[1];
              *plVar10 = (long)plVar11;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar11 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
              psVar1 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_c0.field_2._M_allocated_capacity = *psVar1;
                local_c0.field_2._8_8_ = plVar11[3];
                local_c0._M_dataplus._M_p = (pointer)paVar4;
              }
              else {
                local_c0.field_2._M_allocated_capacity = *psVar1;
                local_c0._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_c0._M_string_length = plVar11[1];
              *plVar11 = (long)psVar1;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != paVar4) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_70 != &local_60) {
                operator_delete(local_70,local_60 + 1);
              }
              if (local_a0 != &local_90) {
                operator_delete(local_a0,local_90 + 1);
              }
              if (local_50[0] != local_40) {
                operator_delete(local_50[0],local_40[0] + 1);
              }
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(prop_names,(value_type *)&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,
                              CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                       local_e8.field_2._M_local_buf[0]) + 1);
            }
            uVar13 = uVar13 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar13 < *(ulong *)(p_Var9 + 4));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                   local_110.field_2._M_local_buf[0]) + 1);
        }
        p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
      } while (p_Var9 != local_80);
    }
    uVar8 = local_c4;
    gprim = local_f0;
    if ((local_f0->proxyPrim)._authored != false) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"proxyPrim","");
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                 &local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
    }
    p_Var9 = (gprim->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(gprim->props)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var2) {
      do {
        if ((((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000 & ((byte)uVar8 ^ 1)
            ) == 0) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(prop_names,(value_type *)(p_Var9 + 1));
        }
        p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var2);
    }
  }
  return gprim != (GPrim *)0x0;
}

Assistant:

bool GetGPrimPropertyNamesImpl(const GPrim *gprim,
                               std::vector<std::string> *prop_names,
                               bool attr_prop, bool rel_prop) {
  if (!gprim) {
    return false;
  }

  if (!prop_names) {
    return false;
  }

  if (attr_prop) {
    if (gprim->doubleSided.authored()) {
      prop_names->push_back("doubleSided");
    }

    if (gprim->orientation.authored()) {
      prop_names->push_back("orientation");
    }

    if (gprim->purpose.authored()) {
      prop_names->push_back("purpose");
    }

    if (gprim->extent.authored()) {
      prop_names->push_back("extent");
    }

    if (gprim->visibility.authored()) {
      prop_names->push_back("visibility");
    }

    // xformOps.
    for (const auto &xop : gprim->xformOps) {
      if (xop.op_type == XformOp::OpType::ResetXformStack) {
        // skip
        continue;
      }
      std::string varname = to_string(xop.op_type);
      if (!xop.suffix.empty()) {
        varname += ":" + xop.suffix;
      }
      prop_names->push_back(varname);
    }
  }

  if (rel_prop) {
    if (gprim->materialBinding) {
      prop_names->push_back(kMaterialBinding);
    }

    if (gprim->materialBindingPreview) {
      prop_names->push_back(kMaterialBindingPreview);
    }

    if (gprim->materialBindingFull) {
      prop_names->push_back(kMaterialBindingFull);
    }

    for (const auto &item : gprim->materialBindingMap()) {
      prop_names->push_back("material:binding:" + item.first);
    }

    for (const auto &collection : gprim->materialBindingCollectionMap()) {
      std::string purpose_name;
      if (!collection.first.empty()) {
        purpose_name = ":" + collection.first;
      }

      for (size_t i = 0; i < collection.second.size(); i++) {
        const std::string &coll_name = collection.second.keys()[i];
        std::string rel_name;
        if (collection.first.empty()) {
          rel_name = kMaterialBindingCollection + purpose_name;
        } else {
          rel_name = kMaterialBindingCollection + std::string(":") + coll_name +
                     purpose_name;
        }

        prop_names->push_back(rel_name);
      }
    }

    if (gprim->proxyPrim.authored()) {
      prop_names->push_back("proxyPrim");
    }
  }

  // other props
  for (const auto &prop : gprim->props) {
    if (prop.second.is_relationship()) {
      if (rel_prop) {
        prop_names->push_back(prop.first);
      }
    } else {  // assume attribute
      if (attr_prop) {
        prop_names->push_back(prop.first);
      }
    }
  }

  return true;
}